

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O2

int IDARcheck3(IDAMem IDA_mem)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  sunrealtype sVar14;
  double dVar15;
  double dVar16;
  sunrealtype t;
  double dVar17;
  
  if (IDA_mem->ida_taskc == 1) {
    uVar6 = -(ulong)((IDA_mem->ida_toutc - IDA_mem->ida_tn) * IDA_mem->ida_hh < 0.0);
    sVar14 = (sunrealtype)(~uVar6 & (ulong)IDA_mem->ida_tn | (ulong)IDA_mem->ida_toutc & uVar6);
    IDA_mem->ida_thi = sVar14;
  }
  else if (IDA_mem->ida_taskc == 2) {
    sVar14 = IDA_mem->ida_tn;
    IDA_mem->ida_thi = sVar14;
  }
  else {
    sVar14 = IDA_mem->ida_thi;
  }
  IDAGetSolution(IDA_mem,sVar14,IDA_mem->ida_yy,IDA_mem->ida_yp);
  iVar3 = (*IDA_mem->ida_gfun)
                    (IDA_mem->ida_thi,IDA_mem->ida_yy,IDA_mem->ida_yp,IDA_mem->ida_ghi,
                     IDA_mem->ida_user_data);
  IDA_mem->ida_nge = IDA_mem->ida_nge + 1;
  iVar4 = -10;
  if (iVar3 == 0) {
    dVar12 = (ABS(IDA_mem->ida_hh) + ABS(IDA_mem->ida_tn)) * IDA_mem->ida_uround * 100.0;
    IDA_mem->ida_ttol = dVar12;
    uVar5 = IDA_mem->ida_nrtfn;
    uVar9 = 0;
    uVar6 = 0;
    if (0 < (int)uVar5) {
      uVar6 = (ulong)uVar5;
    }
    dVar13 = 0.0;
    uVar10 = 0;
    bVar2 = false;
    bVar11 = false;
    for (; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      if (IDA_mem->ida_gactive[uVar9] != 0) {
        dVar15 = IDA_mem->ida_ghi[uVar9];
        if ((dVar15 != 0.0) || (NAN(dVar15))) {
          dVar17 = IDA_mem->ida_glo[uVar9];
          if ((((0.0 < dVar15) && (dVar17 < 0.0)) || ((dVar15 < 0.0 && (0.0 < dVar17)))) &&
             (((double)IDA_mem->ida_rootdir[uVar9] * dVar17 <= 0.0 &&
              (dVar15 = ABS(dVar15 / (dVar15 - dVar17)), dVar13 < dVar15)))) {
            uVar10 = uVar9 & 0xffffffff;
            bVar11 = true;
            dVar13 = dVar15;
          }
        }
        else if ((double)IDA_mem->ida_rootdir[uVar9] * IDA_mem->ida_glo[uVar9] <= 0.0) {
          bVar2 = true;
        }
      }
    }
    if (bVar11) {
      sVar14 = IDA_mem->ida_tlo;
      dVar13 = IDA_mem->ida_thi;
      dVar17 = 1.0;
      dVar15 = 0.5;
      iVar4 = 0;
      iVar3 = -1;
      while( true ) {
        iVar8 = iVar4;
        dVar16 = dVar13 - sVar14;
        if (ABS(dVar16) <= dVar12) goto LAB_0010dabd;
        if (iVar3 == iVar8) {
          dVar17 = dVar17 * dVar15;
        }
        else {
          dVar17 = 1.0;
        }
        t = dVar13 - (dVar16 * IDA_mem->ida_ghi[(int)uVar10]) /
                     (IDA_mem->ida_ghi[(int)uVar10] - IDA_mem->ida_glo[(int)uVar10] * dVar17);
        dVar15 = ABS(dVar16) / dVar12;
        if (ABS(t - sVar14) < dVar12 * 0.5) {
          t = (double)(-(ulong)(5.0 < dVar15) & 0x3fb999999999999a |
                      ~-(ulong)(5.0 < dVar15) & (ulong)(0.5 / dVar15)) * dVar16 + sVar14;
        }
        if (ABS(dVar13 - t) < dVar12 * 0.5) {
          t = (double)(-(ulong)(5.0 < dVar15) & 0xbfb999999999999a |
                      ~-(ulong)(5.0 < dVar15) & (ulong)(-0.5 / dVar15)) * dVar16 + dVar13;
        }
        IDAGetSolution(IDA_mem,t,IDA_mem->ida_yy,IDA_mem->ida_yp);
        iVar4 = (*IDA_mem->ida_gfun)
                          (t,IDA_mem->ida_yy,IDA_mem->ida_yp,IDA_mem->ida_grout,
                           IDA_mem->ida_user_data);
        IDA_mem->ida_nge = IDA_mem->ida_nge + 1;
        if (iVar4 != 0) {
          return -10;
        }
        uVar5 = IDA_mem->ida_nrtfn;
        uVar9 = 0;
        uVar6 = 0;
        if (0 < (int)uVar5) {
          uVar6 = (ulong)uVar5;
        }
        dVar12 = 0.0;
        bVar2 = false;
        bVar11 = false;
        for (; iVar4 = 1, uVar6 != uVar9; uVar9 = uVar9 + 1) {
          if (IDA_mem->ida_gactive[uVar9] != 0) {
            dVar13 = IDA_mem->ida_grout[uVar9];
            if ((dVar13 != 0.0) || (NAN(dVar13))) {
              dVar15 = IDA_mem->ida_glo[uVar9];
              if ((((0.0 < dVar13) && (dVar15 < 0.0)) || ((dVar13 < 0.0 && (0.0 < dVar15)))) &&
                 (((double)IDA_mem->ida_rootdir[uVar9] * dVar15 <= 0.0 &&
                  (dVar13 = ABS(dVar13 / (dVar13 - dVar15)), dVar12 < dVar13)))) {
                uVar10 = uVar9 & 0xffffffff;
                bVar11 = true;
                dVar12 = dVar13;
              }
            }
            else if ((double)IDA_mem->ida_rootdir[uVar9] * IDA_mem->ida_glo[uVar9] <= 0.0) {
              bVar2 = true;
            }
          }
        }
        if (!bVar11) break;
        IDA_mem->ida_thi = t;
        for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
          IDA_mem->ida_ghi[uVar9] = IDA_mem->ida_grout[uVar9];
        }
        sVar14 = IDA_mem->ida_tlo;
        dVar13 = IDA_mem->ida_thi;
        dVar12 = IDA_mem->ida_ttol;
        bVar11 = dVar12 < ABS(dVar13 - sVar14);
        dVar15 = 0.5;
LAB_0010d9b3:
        iVar3 = iVar8;
        if (!bVar11) goto LAB_0010dabd;
      }
      if (!bVar2) {
        IDA_mem->ida_tlo = t;
        for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
          IDA_mem->ida_glo[uVar9] = IDA_mem->ida_grout[uVar9];
        }
        sVar14 = IDA_mem->ida_tlo;
        dVar13 = IDA_mem->ida_thi;
        dVar12 = IDA_mem->ida_ttol;
        bVar11 = dVar12 < ABS(dVar13 - sVar14);
        dVar15 = 2.0;
        iVar4 = 2;
        goto LAB_0010d9b3;
      }
      IDA_mem->ida_thi = t;
      uVar6 = 0;
      uVar9 = 0;
      if (0 < (int)uVar5) {
        uVar9 = (ulong)uVar5;
      }
      for (; uVar9 != uVar6; uVar6 = uVar6 + 1) {
        IDA_mem->ida_ghi[uVar6] = IDA_mem->ida_grout[uVar6];
      }
      dVar13 = IDA_mem->ida_thi;
LAB_0010dabd:
      IDA_mem->ida_trout = dVar13;
      for (lVar7 = 0; lVar7 < (int)uVar5; lVar7 = lVar7 + 1) {
        dVar12 = IDA_mem->ida_ghi[lVar7];
        IDA_mem->ida_grout[lVar7] = dVar12;
        piVar1 = IDA_mem->ida_iroots;
        piVar1[lVar7] = 0;
        if (IDA_mem->ida_gactive[lVar7] != 0) {
          if ((dVar12 != 0.0) || (NAN(dVar12))) {
            dVar13 = IDA_mem->ida_glo[lVar7];
          }
          else {
            dVar13 = IDA_mem->ida_glo[lVar7];
            if ((double)IDA_mem->ida_rootdir[lVar7] * dVar13 <= 0.0) {
              piVar1[lVar7] = (uint)(dVar13 <= 0.0) * 2 + -1;
            }
          }
          if ((((0.0 < dVar12) && (dVar13 < 0.0)) || ((dVar12 < 0.0 && (0.0 < dVar13)))) &&
             ((double)IDA_mem->ida_rootdir[lVar7] * dVar13 <= 0.0)) {
            piVar1[lVar7] = (uint)(dVar13 <= 0.0) * 2 + -1;
          }
        }
        uVar5 = IDA_mem->ida_nrtfn;
      }
      goto LAB_0010db9e;
    }
    IDA_mem->ida_trout = IDA_mem->ida_thi;
    for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      IDA_mem->ida_grout[uVar9] = IDA_mem->ida_ghi[uVar9];
    }
    if (bVar2) {
      for (lVar7 = 0; lVar7 < (int)uVar5; lVar7 = lVar7 + 1) {
        piVar1 = IDA_mem->ida_iroots;
        piVar1[lVar7] = 0;
        if ((((IDA_mem->ida_gactive[lVar7] != 0) && (IDA_mem->ida_ghi[lVar7] == 0.0)) &&
            (!NAN(IDA_mem->ida_ghi[lVar7]))) &&
           ((double)IDA_mem->ida_rootdir[lVar7] * IDA_mem->ida_glo[lVar7] <= 0.0)) {
          piVar1[lVar7] = (uint)(IDA_mem->ida_glo[lVar7] <= 0.0) * 2 + -1;
        }
        uVar5 = IDA_mem->ida_nrtfn;
      }
LAB_0010db9e:
      bVar11 = false;
    }
    else {
      bVar11 = true;
    }
    for (lVar7 = 0; lVar7 < (int)uVar5; lVar7 = lVar7 + 1) {
      if ((IDA_mem->ida_gactive[lVar7] == 0) &&
         ((IDA_mem->ida_grout[lVar7] != 0.0 || (NAN(IDA_mem->ida_grout[lVar7]))))) {
        IDA_mem->ida_gactive[lVar7] = 1;
        uVar5 = IDA_mem->ida_nrtfn;
      }
    }
    IDA_mem->ida_tlo = IDA_mem->ida_trout;
    uVar9 = 0;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = uVar9;
    }
    for (; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      IDA_mem->ida_glo[uVar9] = IDA_mem->ida_grout[uVar9];
    }
    iVar4 = 0;
    if (!bVar11) {
      IDAGetSolution(IDA_mem,IDA_mem->ida_trout,IDA_mem->ida_yy,IDA_mem->ida_yp);
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

static int IDARcheck3(IDAMem IDA_mem)
{
  int i, ier, retval;

  /* Set thi = tn or tout, whichever comes first. */
  if (IDA_mem->ida_taskc == IDA_ONE_STEP)
  {
    IDA_mem->ida_thi = IDA_mem->ida_tn;
  }
  if (IDA_mem->ida_taskc == IDA_NORMAL)
  {
    IDA_mem->ida_thi =
      ((IDA_mem->ida_toutc - IDA_mem->ida_tn) * IDA_mem->ida_hh >= ZERO)
        ? IDA_mem->ida_tn
        : IDA_mem->ida_toutc;
  }

  /* Get y and y' at thi. */
  (void)IDAGetSolution(IDA_mem, IDA_mem->ida_thi, IDA_mem->ida_yy,
                       IDA_mem->ida_yp);

  /* Set ghi = g(thi) and call IDARootfind to search (tlo,thi) for roots. */
  retval = IDA_mem->ida_gfun(IDA_mem->ida_thi, IDA_mem->ida_yy, IDA_mem->ida_yp,
                             IDA_mem->ida_ghi, IDA_mem->ida_user_data);
  IDA_mem->ida_nge++;
  if (retval != 0) { return (IDA_RTFUNC_FAIL); }

  IDA_mem->ida_ttol = ((SUNRabs(IDA_mem->ida_tn) + SUNRabs(IDA_mem->ida_hh)) *
                       IDA_mem->ida_uround * HUNDRED);
  ier               = IDARootfind(IDA_mem);
  if (ier == IDA_RTFUNC_FAIL) { return (IDA_RTFUNC_FAIL); }
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    if (!IDA_mem->ida_gactive[i] && IDA_mem->ida_grout[i] != ZERO)
    {
      IDA_mem->ida_gactive[i] = SUNTRUE;
    }
  }
  IDA_mem->ida_tlo = IDA_mem->ida_trout;
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    IDA_mem->ida_glo[i] = IDA_mem->ida_grout[i];
  }

  /* If no root found, return IDA_SUCCESS. */
  if (ier == IDA_SUCCESS) { return (IDA_SUCCESS); }

  /* If a root was found, interpolate to get y(trout) and return.  */
  (void)IDAGetSolution(IDA_mem, IDA_mem->ida_trout, IDA_mem->ida_yy,
                       IDA_mem->ida_yp);
  return (RTFOUND);
}